

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu541_common.c
# Opt level: O3

MPP_RET vepu541_set_one_roi(void *buf,MppEncROIRegion *region,RK_S32 w,RK_S32 h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  int iVar10;
  void *pvVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar21;
  undefined1 auVar20 [16];
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar38;
  int iVar40;
  undefined1 auVar39 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar43 [16];
  
  if (buf == (void *)0x0 || region == (MppEncROIRegion *)0x0) {
    _mpp_log_l(2,"vepu541_common","invalid buf %p roi %p\n","vepu541_set_one_roi",buf,region);
  }
  else {
    iVar13 = w + 0xf >> 4;
    iVar10 = h + 0xf >> 4;
    uVar18 = (uint)(region->x >> 4);
    uVar12 = (uint)(region->y >> 4);
    iVar19 = (region->w + 0xf >> 4) + uVar18;
    iVar17 = (region->h + 0xf >> 4) + uVar12;
    if (iVar13 <= iVar19) {
      iVar19 = iVar13;
    }
    if (iVar10 <= iVar17) {
      iVar17 = iVar10;
    }
    if (region->x < 0x10) {
      uVar18 = 0;
    }
    if (region->y < 0x10) {
      uVar12 = 0;
    }
    if (iVar19 <= (int)uVar18) {
      _mpp_log_l(2,"vepu541_common","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "pos_x_end > pos_x_init","vepu541_set_one_roi",0x17a);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00262bec;
    }
    if (iVar17 <= (int)uVar12) {
      _mpp_log_l(2,"vepu541_common","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "pos_y_end > pos_y_init","vepu541_set_one_roi",0x17b);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00262bec:
        abort();
      }
    }
    auVar8 = _DAT_002aa580;
    auVar7 = _DAT_002aa570;
    auVar6 = _DAT_002788f0;
    auVar5 = _DAT_00277a10;
    auVar4 = _DAT_00277a00;
    if ((int)uVar12 < iVar17) {
      uVar14 = iVar13 + 3U & 0xfffffffc;
      uVar9 = (region->quality & 0x7fU) << 8 | (region->qp_area_idx & 0xf) << 4 | region->intra & 1
              | (ushort)region->abs_qp_en << 0xf | 0x80;
      pvVar11 = (void *)((long)buf + (long)(int)(uVar12 * uVar14 + uVar18) * 2);
      uVar15 = ~uVar18 + iVar19;
      auVar20._4_4_ = 0;
      auVar20._0_4_ = uVar15;
      auVar20._8_4_ = uVar15;
      auVar20._12_4_ = 0;
      iVar10 = 0;
      auVar20 = auVar20 ^ _DAT_00277a10;
      do {
        if ((int)uVar18 < iVar19) {
          uVar16 = 0;
          do {
            auVar32._8_4_ = (int)uVar16;
            auVar32._0_8_ = uVar16;
            auVar32._12_4_ = (int)(uVar16 >> 0x20);
            auVar24 = (auVar32 | auVar4) ^ auVar5;
            iVar13 = auVar20._0_4_;
            iVar38 = -(uint)(iVar13 < auVar24._0_4_);
            iVar21 = auVar20._4_4_;
            auVar25._4_4_ = -(uint)(iVar21 < auVar24._4_4_);
            iVar37 = auVar20._8_4_;
            iVar40 = -(uint)(iVar37 < auVar24._8_4_);
            iVar22 = auVar20._12_4_;
            auVar25._12_4_ = -(uint)(iVar22 < auVar24._12_4_);
            auVar34._4_4_ = iVar38;
            auVar34._0_4_ = iVar38;
            auVar34._8_4_ = iVar40;
            auVar34._12_4_ = iVar40;
            auVar41 = pshuflw(in_XMM11,auVar34,0xe8);
            auVar27._4_4_ = -(uint)(auVar24._4_4_ == iVar21);
            auVar27._12_4_ = -(uint)(auVar24._12_4_ == iVar22);
            auVar27._0_4_ = auVar27._4_4_;
            auVar27._8_4_ = auVar27._12_4_;
            auVar43 = pshuflw(in_XMM12,auVar27,0xe8);
            auVar25._0_4_ = auVar25._4_4_;
            auVar25._8_4_ = auVar25._12_4_;
            auVar42 = pshuflw(auVar41,auVar25,0xe8);
            auVar24._8_4_ = 0xffffffff;
            auVar24._0_8_ = 0xffffffffffffffff;
            auVar24._12_4_ = 0xffffffff;
            auVar24 = (auVar42 | auVar43 & auVar41) ^ auVar24;
            auVar24 = packssdw(auVar24,auVar24);
            if ((auVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(ushort *)((long)pvVar11 + uVar16 * 2) = uVar9;
            }
            auVar25 = auVar27 & auVar34 | auVar25;
            auVar24 = packssdw(auVar25,auVar25);
            auVar42._8_4_ = 0xffffffff;
            auVar42._0_8_ = 0xffffffffffffffff;
            auVar42._12_4_ = 0xffffffff;
            auVar24 = packssdw(auVar24 ^ auVar42,auVar24 ^ auVar42);
            if ((auVar24._0_4_ >> 0x10 & 1) != 0) {
              *(ushort *)((long)pvVar11 + uVar16 * 2 + 2) = uVar9;
            }
            auVar24 = (auVar32 | auVar6) ^ auVar5;
            iVar38 = -(uint)(iVar13 < auVar24._0_4_);
            auVar39._4_4_ = -(uint)(iVar21 < auVar24._4_4_);
            iVar40 = -(uint)(iVar37 < auVar24._8_4_);
            auVar39._12_4_ = -(uint)(iVar22 < auVar24._12_4_);
            auVar26._4_4_ = iVar38;
            auVar26._0_4_ = iVar38;
            auVar26._8_4_ = iVar40;
            auVar26._12_4_ = iVar40;
            auVar33._4_4_ = -(uint)(auVar24._4_4_ == iVar21);
            auVar33._12_4_ = -(uint)(auVar24._12_4_ == iVar22);
            auVar33._0_4_ = auVar33._4_4_;
            auVar33._8_4_ = auVar33._12_4_;
            auVar39._0_4_ = auVar39._4_4_;
            auVar39._8_4_ = auVar39._12_4_;
            auVar24 = auVar33 & auVar26 | auVar39;
            auVar24 = packssdw(auVar24,auVar24);
            auVar1._8_4_ = 0xffffffff;
            auVar1._0_8_ = 0xffffffffffffffff;
            auVar1._12_4_ = 0xffffffff;
            auVar24 = packssdw(auVar24 ^ auVar1,auVar24 ^ auVar1);
            if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(ushort *)((long)pvVar11 + uVar16 * 2 + 4) = uVar9;
            }
            auVar27 = pshufhw(auVar26,auVar26,0x84);
            auVar34 = pshufhw(auVar33,auVar33,0x84);
            auVar25 = pshufhw(auVar27,auVar39,0x84);
            auVar28._8_4_ = 0xffffffff;
            auVar28._0_8_ = 0xffffffffffffffff;
            auVar28._12_4_ = 0xffffffff;
            auVar28 = (auVar25 | auVar34 & auVar27) ^ auVar28;
            auVar27 = packssdw(auVar28,auVar28);
            if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(ushort *)((long)pvVar11 + uVar16 * 2 + 6) = uVar9;
            }
            auVar27 = (auVar32 | auVar8) ^ auVar5;
            iVar38 = -(uint)(iVar13 < auVar27._0_4_);
            auVar30._4_4_ = -(uint)(iVar21 < auVar27._4_4_);
            iVar40 = -(uint)(iVar37 < auVar27._8_4_);
            auVar30._12_4_ = -(uint)(iVar22 < auVar27._12_4_);
            auVar35._4_4_ = iVar38;
            auVar35._0_4_ = iVar38;
            auVar35._8_4_ = iVar40;
            auVar35._12_4_ = iVar40;
            auVar24 = pshuflw(auVar24,auVar35,0xe8);
            auVar29._4_4_ = -(uint)(auVar27._4_4_ == iVar21);
            auVar29._12_4_ = -(uint)(auVar27._12_4_ == iVar22);
            auVar29._0_4_ = auVar29._4_4_;
            auVar29._8_4_ = auVar29._12_4_;
            auVar27 = pshuflw(auVar43 & auVar41,auVar29,0xe8);
            in_XMM12 = auVar27 & auVar24;
            auVar30._0_4_ = auVar30._4_4_;
            auVar30._8_4_ = auVar30._12_4_;
            auVar24 = pshuflw(auVar24,auVar30,0xe8);
            auVar41._8_4_ = 0xffffffff;
            auVar41._0_8_ = 0xffffffffffffffff;
            auVar41._12_4_ = 0xffffffff;
            auVar41 = (auVar24 | in_XMM12) ^ auVar41;
            in_XMM11 = packssdw(auVar41,auVar41);
            if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(ushort *)((long)pvVar11 + uVar16 * 2 + 8) = uVar9;
            }
            auVar30 = auVar29 & auVar35 | auVar30;
            auVar24 = packssdw(auVar30,auVar30);
            auVar43._8_4_ = 0xffffffff;
            auVar43._0_8_ = 0xffffffffffffffff;
            auVar43._12_4_ = 0xffffffff;
            auVar24 = packssdw(auVar24 ^ auVar43,auVar24 ^ auVar43);
            if ((auVar24 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(ushort *)((long)pvVar11 + uVar16 * 2 + 10) = uVar9;
            }
            auVar24 = (auVar32 | auVar7) ^ auVar5;
            iVar13 = -(uint)(iVar13 < auVar24._0_4_);
            auVar36._4_4_ = -(uint)(iVar21 < auVar24._4_4_);
            iVar37 = -(uint)(iVar37 < auVar24._8_4_);
            auVar36._12_4_ = -(uint)(iVar22 < auVar24._12_4_);
            auVar31._4_4_ = iVar13;
            auVar31._0_4_ = iVar13;
            auVar31._8_4_ = iVar37;
            auVar31._12_4_ = iVar37;
            auVar23._4_4_ = -(uint)(auVar24._4_4_ == iVar21);
            auVar23._12_4_ = -(uint)(auVar24._12_4_ == iVar22);
            auVar23._0_4_ = auVar23._4_4_;
            auVar23._8_4_ = auVar23._12_4_;
            auVar36._0_4_ = auVar36._4_4_;
            auVar36._8_4_ = auVar36._12_4_;
            auVar24 = auVar23 & auVar31 | auVar36;
            auVar24 = packssdw(auVar24,auVar24);
            auVar2._8_4_ = 0xffffffff;
            auVar2._0_8_ = 0xffffffffffffffff;
            auVar2._12_4_ = 0xffffffff;
            auVar24 = packssdw(auVar24 ^ auVar2,auVar24 ^ auVar2);
            if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(ushort *)((long)pvVar11 + uVar16 * 2 + 0xc) = uVar9;
            }
            auVar32 = pshufhw(auVar31,auVar31,0x84);
            auVar24 = pshufhw(auVar23,auVar23,0x84);
            auVar27 = pshufhw(auVar32,auVar36,0x84);
            auVar3._8_4_ = 0xffffffff;
            auVar3._0_8_ = 0xffffffffffffffff;
            auVar3._12_4_ = 0xffffffff;
            auVar24 = packssdw(auVar24 & auVar32,(auVar27 | auVar24 & auVar32) ^ auVar3);
            if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(ushort *)((long)pvVar11 + uVar16 * 2 + 0xe) = uVar9;
            }
            uVar16 = uVar16 + 8;
          } while (((ulong)uVar15 + 8 & 0xfffffffffffffff8) != uVar16);
        }
        iVar10 = iVar10 + 1;
        pvVar11 = (void *)((long)pvVar11 + (long)(int)uVar14 * 2);
      } while (iVar10 != iVar17 - uVar12);
    }
  }
  return MPP_NOK;
}

Assistant:

MPP_RET vepu541_set_one_roi(void *buf, MppEncROIRegion *region, RK_S32 w, RK_S32 h)
{
    Vepu541RoiCfg *ptr = (Vepu541RoiCfg *)buf;
    RK_S32 mb_w = MPP_ALIGN(w, 16) / 16;
    RK_S32 mb_h = MPP_ALIGN(h, 16) / 16;
    RK_S32 stride_h = MPP_ALIGN(mb_w, 4);
    Vepu541RoiCfg cfg;
    MPP_RET ret = MPP_NOK;

    if (NULL == buf || NULL == region) {
        mpp_err_f("invalid buf %p roi %p\n", buf, region);
        goto DONE;
    }

    RK_S32 roi_width  = (region->w + 15) / 16;
    RK_S32 roi_height = (region->h + 15) / 16;
    RK_S32 pos_x_init = region->x / 16;
    RK_S32 pos_y_init = region->y / 16;
    RK_S32 pos_x_end  = pos_x_init + roi_width;
    RK_S32 pos_y_end  = pos_y_init + roi_height;
    RK_S32 x, y;

    pos_x_end = MPP_MIN(pos_x_end, mb_w);
    pos_y_end = MPP_MIN(pos_y_end, mb_h);
    pos_x_init = MPP_MAX(pos_x_init, 0);
    pos_y_init = MPP_MAX(pos_y_init, 0);

    mpp_assert(pos_x_end > pos_x_init);
    mpp_assert(pos_y_end > pos_y_init);

    cfg.force_intra = region->intra;
    cfg.reserved    = 0;
    cfg.qp_area_idx = region->qp_area_idx;
    // NOTE: When roi is enabled the qp_area_en should be one.
    cfg.qp_area_en  = 1;    // region->area_map_en;
    cfg.qp_adj      = region->quality;
    cfg.qp_adj_mode = region->abs_qp_en;

    ptr += pos_y_init * stride_h + pos_x_init;
    roi_width = pos_x_end - pos_x_init;
    roi_height = pos_y_end - pos_y_init;

    for (y = 0; y < roi_height; y++) {
        Vepu541RoiCfg *dst = ptr;

        for (x = 0; x < roi_width; x++, dst++)
            memcpy(dst, &cfg, sizeof(cfg));

        ptr += stride_h;
    }
DONE:
    return ret;
}